

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-bset.c
# Opt level: O1

_Bool Curl_uint_bset_next(uint_bset *bset,uint last,uint *pnext)

{
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  uVar5 = last + 1;
  uVar3 = uVar5 >> 6;
  uVar4 = (ulong)uVar3;
  uVar6 = 0xffffffff;
  if (uVar3 < bset->nslots) {
    uVar8 = bset->slots[uVar3] >> ((byte)uVar5 & 0x3f);
    if (uVar8 == 0) {
      iVar7 = -(uVar5 & 0xffffffc0);
      do {
        uVar4 = uVar4 + 1;
        if (bset->nslots == (uint)uVar4) goto LAB_00161c18;
        uVar8 = bset->slots[uVar4];
        iVar7 = iVar7 + -0x40;
      } while (uVar8 == 0);
      lVar1 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar6 = (int)lVar1 - iVar7;
      _Var2 = true;
    }
    else {
      lVar1 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar6 = uVar5 + (int)lVar1;
      _Var2 = true;
    }
  }
  else {
LAB_00161c18:
    _Var2 = false;
  }
  *pnext = uVar6;
  return _Var2;
}

Assistant:

bool Curl_uint_bset_next(struct uint_bset *bset, unsigned int last,
                         unsigned int *pnext)
{
  unsigned int islot;
  curl_uint64_t x;

  ++last; /* look for number one higher than last */
  islot = last / 64; /* the slot this would be in */
  if(islot < bset->nslots) {
    /* shift away the bits we already iterated in this slot */
    x = (bset->slots[islot] >> (last % 64));
    if(x) {
      /* more bits set, next is `last` + trailing0s of the shifted slot */
      *pnext = last + CURL_CTZ64(x);
      return TRUE;
    }
    /* no more bits set in the last slot, scan forward */
    for(islot = islot + 1; islot < bset->nslots; ++islot) {
      if(bset->slots[islot]) {
        *pnext = (islot * 64) + CURL_CTZ64(bset->slots[islot]);
        return TRUE;
      }
    }
  }
  *pnext = UINT_MAX; /* a value we cannot store */
  return FALSE;
}